

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::DynamicStruct::Builder::which
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,Builder *this)

{
  uint uVar1;
  Reader RStack_48;
  
  Schema::getProto(&RStack_48,(Schema *)this);
  if ((RStack_48._reader.dataSize < 0x100) || (*(short *)((long)RStack_48._reader.data + 0x1e) == 0)
     ) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    if (RStack_48._reader.dataSize < 0x120) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(uint *)((long)RStack_48._reader.data + 0x20);
    }
    StructSchema::getFieldByDiscriminant
              (__return_storage_ptr__,&this->schema,
               *(uint16_t *)((long)(this->builder).data + (ulong)uVar1 * 2));
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> DynamicStruct::Builder::which() {
  auto structProto = schema.getProto().getStruct();
  if (structProto.getDiscriminantCount() == 0) {
    return kj::none;
  }

  uint16_t discrim = builder.getDataField<uint16_t>(
      assumeDataOffset(structProto.getDiscriminantOffset()));
  return schema.getFieldByDiscriminant(discrim);
}